

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

void __thiscall
QNetworkRequestFactoryPrivate::QNetworkRequestFactoryPrivate(QNetworkRequestFactoryPrivate *this)

{
  QSslConfiguration *in_RDI;
  long in_FS_OFFSET;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedData::QSharedData((QSharedData *)0x32859a);
  QSslConfiguration::QSslConfiguration(in_RDI);
  QUrl::QUrl((QUrl *)(in_RDI + 2));
  QHttpHeaders::QHttpHeaders((QHttpHeaders *)0x3285c4);
  QByteArray::QByteArray((QByteArray *)0x3285d2);
  QString::QString((QString *)0x3285e0);
  QString::QString((QString *)0x3285ee);
  QUrlQuery::QUrlQuery((QUrlQuery *)(in_RDI + 0xd));
  *(undefined4 *)&in_RDI[0xe].d.d.ptr = 3;
  local_c = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)(in_RDI + 0xf),&local_c);
  QHash<QNetworkRequest::Attribute,_QVariant>::QHash
            ((QHash<QNetworkRequest::Attribute,_QVariant> *)(in_RDI + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkRequestFactoryPrivate::QNetworkRequestFactoryPrivate()
    = default;